

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

void voronoiAccess3D(uint64_t sha,int x,int y,int z,int *x4,int *y4,int *z4)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  int b;
  int a;
  long lVar4;
  uint uVar5;
  int iVar6;
  int c;
  uint uVar7;
  int local_94;
  int local_90;
  int local_8c;
  int local_74;
  int local_70;
  int local_6c;
  ulong local_68;
  int *local_60;
  int *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  uint64_t local_38;
  
  local_40 = (ulong)(uint)((int)(y - 2U) >> 2);
  local_48 = (ulong)(uint)((int)(z - 2U) >> 2);
  uVar1 = (x - 2U & 3) * 0x2800;
  local_50 = (ulong)uVar1;
  local_68 = 0xffffffffffffffff;
  local_8c = 0;
  local_90 = 0;
  local_94 = 0;
  local_60 = x4;
  local_58 = y4;
  local_38 = sha;
  for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
    a = (((int)(x - 2U) >> 2) + 1) - (uint)(uVar5 < 4);
    iVar6 = (int)local_50;
    if (3 < uVar5) {
      iVar6 = uVar1 - 0xa000;
    }
    uVar7 = uVar5 >> 1 & 1;
    b = uVar7 + (int)local_40;
    c = (uVar5 & 1) + (int)local_48;
    getVoronoiCell(local_38,a,b,c,&local_6c,&local_70,&local_74);
    lVar4 = (long)(int)(uVar7 * -0xa000 + (y - 2U & 3) * 0x2800) + (long)local_70;
    lVar2 = (long)(int)((uVar5 & 1) * -0xa000 + (z - 2U & 3) * 0x2800) + (long)local_74;
    uVar3 = lVar2 * lVar2 + ((long)iVar6 + (long)local_6c) * ((long)iVar6 + (long)local_6c) +
            lVar4 * lVar4;
    if (uVar3 < local_68) {
      local_94 = a;
      local_90 = b;
      local_8c = c;
      local_68 = uVar3;
    }
  }
  if (local_60 != (int *)0x0) {
    *local_60 = local_94;
  }
  if (local_58 != (int *)0x0) {
    *local_58 = local_90;
  }
  if (z4 != (int *)0x0) {
    *z4 = local_8c;
  }
  return;
}

Assistant:

void voronoiAccess3D(uint64_t sha, int x, int y, int z, int *x4, int *y4, int *z4)
{
    x -= 2;
    y -= 2;
    z -= 2;
    int pX = x >> 2;
    int pY = y >> 2;
    int pZ = z >> 2;
    int dx = (x & 3) * 10240;
    int dy = (y & 3) * 10240;
    int dz = (z & 3) * 10240;
    int ax = 0, ay = 0, az = 0;
    uint64_t dmin = (uint64_t)-1;
    int i;

    for (i = 0; i < 8; i++)
    {
        int bx = (i & 4) != 0;
        int by = (i & 2) != 0;
        int bz = (i & 1) != 0;
        int cx = pX + bx;
        int cy = pY + by;
        int cz = pZ + bz;
        int rx, ry, rz;

        getVoronoiCell(sha, cx, cy, cz, &rx, &ry, &rz);

        rx += dx - 40*1024*bx;
        ry += dy - 40*1024*by;
        rz += dz - 40*1024*bz;

        uint64_t d = rx*(uint64_t)rx + ry*(uint64_t)ry + rz*(uint64_t)rz;
        if (d < dmin)
        {
            dmin = d;
            ax = cx;
            ay = cy;
            az = cz;
        }
    }

    if (x4) *x4 = ax;
    if (y4) *y4 = ay;
    if (z4) *z4 = az;
}